

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hh
# Opt level: O0

void __thiscall brown::Timer::Timer(Timer *this,_func_void_Timer_ptr_Simulator_ptr *cb)

{
  _func_void_Timer_ptr_Simulator_ptr *cb_local;
  Timer *this_local;
  
  this->cb = (_func_void_Timer_ptr_Simulator_ptr *)0x0;
  this->isRunning = false;
  this->prescaler = 0;
  this->period = 0;
  this->cb = cb;
  return;
}

Assistant:

Timer(void (*cb)(Timer&,Simulator&)) {this->cb = cb;}